

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O1

void __thiscall
CodeGenerator::CodeGenerator
          (CodeGenerator *this,
          vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> *p)

{
  string local_40;
  
  (this->lagrange_polynomial).
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lagrange_polynomial).
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lagrange_polynomial).
  super__Vector_base<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->func)._M_dataplus._M_p = (pointer)&(this->func).field_2;
  (this->func)._M_string_length = 0;
  (this->func).field_2._M_local_buf[0] = '\0';
  std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::operator=
            (&this->lagrange_polynomial,p);
  get_polynomial_string_abi_cxx11_(&local_40,this);
  std::__cxx11::string::operator=((string *)&this->func,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

CodeGenerator::CodeGenerator(vector<LagrangePolynomial::element> p) {
    CodeGenerator::lagrange_polynomial = p;
    CodeGenerator::func = get_polynomial_string();
}